

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vp9_header_parser.cc
# Opt level: O0

int __thiscall vp9_parser::Vp9HeaderParser::ReadBit(Vp9HeaderParser *this)

{
  ulong uVar1;
  int bit;
  int bit_shift;
  size_t byte_offset;
  size_t off;
  Vp9HeaderParser *this_local;
  
  uVar1 = this->bit_offset_ >> 3;
  if (uVar1 < this->frame_size_) {
    this_local._4_4_ =
         (int)(uint)this->frame_[uVar1] >> (7 - ((byte)this->bit_offset_ & 7) & 0x1f) & 1;
    this->bit_offset_ = this->bit_offset_ + 1;
  }
  else {
    this_local._4_4_ = 0;
  }
  return this_local._4_4_;
}

Assistant:

int Vp9HeaderParser::ReadBit() {
  const size_t off = bit_offset_;
  const size_t byte_offset = off >> 3;
  const int bit_shift = 7 - static_cast<int>(off & 0x7);
  if (byte_offset < frame_size_) {
    const int bit = (frame_[byte_offset] >> bit_shift) & 1;
    bit_offset_++;
    return bit;
  } else {
    return 0;
  }
}